

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_conv_1d_1s(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  int ne [4];
  _Bool is_node;
  undefined8 in_stack_ffffffffffffffb8;
  ggml_context *in_stack_ffffffffffffffc0;
  
  _Var1 = ggml_is_matrix(in_RDX);
  if (!_Var1) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x1004,
            "ggml_is_matrix(b)");
    abort();
  }
  if (in_RSI->ne[1] != in_RDX->ne[1]) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x1005,
            "a->ne[1] == b->ne[1]");
    abort();
  }
  if (in_RSI->ne[3] != 1) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x1006,
            "a->ne[3] == 1");
    abort();
  }
  if ((in_RSI->grad == (ggml_tensor *)0x0) && (in_RDX->grad == (ggml_tensor *)0x0)) {
    pgVar2 = ggml_new_tensor(in_stack_ffffffffffffffc0,
                             (ggml_type)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                             (int)in_stack_ffffffffffffffb8,(int *)0x157078);
    pgVar2->op = GGML_OP_CONV_1D_1S;
    pgVar2->grad = (ggml_tensor *)0x0;
    pgVar2->src0 = in_RSI;
    pgVar2->src1 = in_RDX;
    return pgVar2;
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x100a,
          "false");
  abort();
}

Assistant:

struct ggml_tensor * ggml_conv_1d_1s(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b) {
    GGML_ASSERT(ggml_is_matrix(b));
    GGML_ASSERT(a->ne[1] == b->ne[1]);
    GGML_ASSERT(a->ne[3] == 1);
    bool is_node = false;

    if (a->grad || b->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    const int ne[4] = { b->ne[0], a->ne[2], 1, 1, };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 2, ne);

    result->op   = GGML_OP_CONV_1D_1S;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = b;

    return result;
}